

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestLaunch.cxx
# Opt level: O3

void __thiscall cmCTestLaunch::ComputeFileNames(cmCTestLaunch *this)

{
  string *psVar1;
  char *pcVar2;
  char *__s;
  cmsysMD5 *md5;
  pointer pbVar3;
  char hash [32];
  char acStack_48 [40];
  
  __s = getenv("CTEST_LAUNCH_LOGS");
  if ((__s != (char *)0x0) && (*__s != '\0')) {
    this->Passthru = false;
    psVar1 = &this->LogDir;
    pcVar2 = (char *)(this->LogDir)._M_string_length;
    strlen(__s);
    std::__cxx11::string::_M_replace((ulong)psVar1,0,pcVar2,(ulong)__s);
    cmsys::SystemTools::ConvertToUnixSlashes(psVar1);
    std::__cxx11::string::append((char *)psVar1);
    md5 = cmsysMD5_New();
    cmsysMD5_Initialize(md5);
    cmsysMD5_Append(md5,(uchar *)(this->CWD)._M_dataplus._M_p,-1);
    for (pbVar3 = (this->RealArgs).
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        pbVar3 != (this->RealArgs).
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish; pbVar3 = pbVar3 + 1) {
      cmsysMD5_Append(md5,(uchar *)(pbVar3->_M_dataplus)._M_p,-1);
    }
    cmsysMD5_FinalizeHex(md5,acStack_48);
    cmsysMD5_Delete(md5);
    std::__cxx11::string::_M_replace
              ((ulong)&this->LogHash,0,(char *)(this->LogHash)._M_string_length,(ulong)acStack_48);
    psVar1 = &this->LogOut;
    std::__cxx11::string::_M_assign((string *)psVar1);
    std::__cxx11::string::append((char *)psVar1);
    std::__cxx11::string::_M_append((char *)psVar1,(ulong)(this->LogHash)._M_dataplus._M_p);
    std::__cxx11::string::append((char *)psVar1);
    psVar1 = &this->LogErr;
    std::__cxx11::string::_M_assign((string *)psVar1);
    std::__cxx11::string::append((char *)psVar1);
    std::__cxx11::string::_M_append((char *)psVar1,(ulong)(this->LogHash)._M_dataplus._M_p);
    std::__cxx11::string::append((char *)psVar1);
  }
  return;
}

Assistant:

void cmCTestLaunch::ComputeFileNames()
{
  // We just passthru the behavior of the real command unless the
  // CTEST_LAUNCH_LOGS environment variable is set.
  const char* d = getenv("CTEST_LAUNCH_LOGS");
  if(!(d && *d))
    {
    return;
    }
  this->Passthru = false;

  // The environment variable specifies the directory into which we
  // generate build logs.
  this->LogDir = d;
  cmSystemTools::ConvertToUnixSlashes(this->LogDir);
  this->LogDir += "/";

  // We hash the input command working dir and command line to obtain
  // a repeatable and (probably) unique name for log files.
  char hash[32];
  cmsysMD5* md5 = cmsysMD5_New();
  cmsysMD5_Initialize(md5);
  cmsysMD5_Append(md5, (unsigned char const*)(this->CWD.c_str()), -1);
  for(std::vector<std::string>::const_iterator ai = this->RealArgs.begin();
      ai != this->RealArgs.end(); ++ai)
    {
    cmsysMD5_Append(md5, (unsigned char const*)ai->c_str(), -1);
    }
  cmsysMD5_FinalizeHex(md5, hash);
  cmsysMD5_Delete(md5);
  this->LogHash.assign(hash, 32);

  // We store stdout and stderr in temporary log files.
  this->LogOut = this->LogDir;
  this->LogOut += "launch-";
  this->LogOut += this->LogHash;
  this->LogOut += "-out.txt";
  this->LogErr = this->LogDir;
  this->LogErr += "launch-";
  this->LogErr += this->LogHash;
  this->LogErr += "-err.txt";
}